

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::setHorizontalHeader(QTableView *this,QHeaderView *header)

{
  long lVar1;
  long *plVar2;
  void **ppvVar3;
  undefined8 uVar4;
  QAbstractItemModel *pQVar5;
  undefined4 *puVar6;
  unsigned_long __i0;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QSlotObjectBase local_c0;
  code *local_b0;
  ImplFn local_a8;
  code *local_a0;
  ImplFn local_98;
  code *local_90;
  ImplFn local_88;
  code *local_80;
  ImplFn local_78;
  code *local_70;
  undefined8 local_68;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((header != (QHeaderView *)0x0) &&
     (lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8, *(QHeaderView **)(lVar1 + 0x580) != header)) {
    lVar8 = 0;
    do {
      QObject::disconnect((Connection *)(lVar1 + 0x600 + lVar8));
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x28);
    plVar2 = *(long **)(lVar1 + 0x580);
    if ((plVar2 != (long *)0x0) && (*(QTableView **)(plVar2[1] + 0x10) == this)) {
      (**(code **)(*plVar2 + 0x20))();
    }
    *(QHeaderView **)(lVar1 + 0x580) = header;
    QWidget::setParent((QWidget *)header,(QWidget *)this);
    QHeaderView::setFirstSectionMovable(*(QHeaderView **)(lVar1 + 0x580),true);
    pQVar5 = QAbstractItemView::model(*(QAbstractItemView **)(lVar1 + 0x580));
    if (pQVar5 == (QAbstractItemModel *)0x0) {
      (**(code **)(**(long **)(lVar1 + 0x580) + 0x1c8))
                (*(long **)(lVar1 + 0x580),*(undefined8 *)(lVar1 + 0x2f8));
      lVar8 = *(long *)(lVar1 + 800);
      if (((lVar8 != 0) && (*(int *)(lVar8 + 4) != 0)) && (*(long *)(lVar1 + 0x328) != 0)) {
        lVar7 = *(long *)(lVar1 + 0x328);
        if (*(int *)(lVar8 + 4) == 0) {
          lVar7 = 0;
        }
        (**(code **)(**(long **)(lVar1 + 0x580) + 0x1d0))(*(long **)(lVar1 + 0x580),lVar7);
      }
    }
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_80 = columnResized;
    lVar8 = 0;
    local_78 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionResized;
    local_68 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::
         QCallableObject<void_(QTableView::*)(int,_int,_int),_QtPrivate::List<int,_int,_int>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = columnResized;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_60,ppvVar3,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_80,
               (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_90 = columnMoved;
    local_88 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionMoved;
    local_68 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::
         QCallableObject<void_(QTableView::*)(int,_int,_int),_QtPrivate::List<int,_int,_int>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = columnMoved;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_58,ppvVar3,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_90,
               (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_a0 = columnCountChanged;
    local_98 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionCountChanged;
    local_68 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QCallableObject<void_(QTableView::*)(int,_int),_QtPrivate::List<int,_int>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = columnCountChanged;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_50,ppvVar3,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_a0,
               (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_b0 = resizeColumnToContents;
    local_a8 = (ImplFn)0x0;
    local_70 = QHeaderView::sectionHandleDoubleClicked;
    local_68 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QCallableObject<void_(QTableView::*)(int),_QtPrivate::List<int>,_void>::impl;
    *(code **)(puVar6 + 4) = resizeColumnToContents;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_48,ppvVar3,(QObject *)&local_70,(void **)this,(QSlotObjectBase *)&local_b0,
               (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_c0.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x269;
    local_c0._4_4_ = 0;
    local_c0.m_impl = (ImplFn)0x0;
    local_70 = QHeaderView::geometriesChanged;
    local_68 = 0;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QCallableObject<void_(QTableView::*)(),_QtPrivate::List<>,_void>::impl;
    *(undefined8 *)(puVar6 + 4) = 0x269;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_40,ppvVar3,(QObject *)&local_70,(void **)this,&local_c0,(ConnectionType)puVar6,
               (int *)0x0,(QMetaObject *)0x0);
    do {
      uVar4 = *(undefined8 *)(lVar1 + 0x600 + lVar8 * 8);
      *(undefined8 *)(lVar1 + 0x600 + lVar8 * 8) = *(undefined8 *)(local_58 + lVar8 * 8 + -8);
      *(undefined8 *)(local_58 + lVar8 * 8 + -8) = uVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    lVar8 = 0x20;
    do {
      QMetaObject::Connection::~Connection((Connection *)(local_58 + lVar8 + -8));
      lVar8 = lVar8 + -8;
    } while (lVar8 != -8);
    setSortingEnabled(this,*(bool *)(lVar1 + 0x640));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::setHorizontalHeader(QHeaderView *header)
{
    Q_D(QTableView);

    if (!header || header == d->horizontalHeader)
        return;
    for (const QMetaObject::Connection &connection : d->horHeaderConnections)
        disconnect(connection);
    if (d->horizontalHeader && d->horizontalHeader->parent() == this)
        delete d->horizontalHeader;
    d->horizontalHeader = header;
    d->horizontalHeader->setParent(this);
    d->horizontalHeader->setFirstSectionMovable(true);
    if (!d->horizontalHeader->model()) {
        d->horizontalHeader->setModel(d->model);
        if (d->selectionModel)
            d->horizontalHeader->setSelectionModel(d->selectionModel);
    }

    d->horHeaderConnections = {
        connect(d->horizontalHeader,&QHeaderView::sectionResized,
                this, &QTableView::columnResized),
        connect(d->horizontalHeader, &QHeaderView::sectionMoved,
                this, &QTableView::columnMoved),
        connect(d->horizontalHeader, &QHeaderView::sectionCountChanged,
                this, &QTableView::columnCountChanged),
        connect(d->horizontalHeader, &QHeaderView::sectionHandleDoubleClicked,
                this, &QTableView::resizeColumnToContents),
        connect(d->horizontalHeader, &QHeaderView::geometriesChanged,
                this, &QTableView::updateGeometries),
    };
    //update the sorting enabled states on the new header
    setSortingEnabled(d->sortingEnabled);
}